

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acknowledge_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Acknowledge_PDU::Acknowledge_PDU
          (Acknowledge_PDU *this,Stop_Freeze_PDU *pdu,AcknowledgeResponseFlag ARF)

{
  KUINT32 KVar1;
  EntityIdentifier *OriginatingEntityID;
  EntityIdentifier *ReceivingEntityID;
  
  OriginatingEntityID =
       Simulation_Management_Header::GetOriginatingEntityID
                 (&pdu->super_Simulation_Management_Header);
  ReceivingEntityID =
       Simulation_Management_Header::GetReceivingEntityID(&pdu->super_Simulation_Management_Header);
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header,OriginatingEntityID,ReceivingEntityID);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Acknowledge_PDU_0022b970;
  this->m_ui16AcknowledgeFlag = 4;
  this->m_ui16ResponseFlag = (KUINT16)ARF;
  KVar1 = Stop_Freeze_PDU::GetRequestID(pdu);
  this->m_ui32RequestID = KVar1;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '\x0f';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x20;
  return;
}

Assistant:

Acknowledge_PDU::Acknowledge_PDU( const Stop_Freeze_PDU & pdu, AcknowledgeResponseFlag ARF ) :
    Simulation_Management_Header( pdu.GetOriginatingEntityID(), pdu.GetReceivingEntityID() ),
    m_ui16AcknowledgeFlag( Stop_FreezePDU ),
    m_ui16ResponseFlag( ARF ),
    m_ui32RequestID( pdu.GetRequestID() )
{
    m_ui8PDUType = Acknowledge_PDU_Type;
    m_ui16PDULength = ACKNOWLEDGE_PDU_SIZE;
}